

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = state->size;
  uVar2 = state->position;
  if (uVar2 < uVar1) {
    uVar5 = (uint)state->text[uVar2];
  }
  else {
    uVar5 = 0xffffffff;
  }
  if ((uVar5 == 0x5f) || ((uVar5 & 0xffffffdf) - 0x41 < 0x1a)) {
    puVar3 = state->text;
    do {
      uVar6 = uVar2;
      uVar5 = 0xffffffff;
      if (uVar6 < uVar1) {
        uVar5 = (uint)puVar3[uVar6];
      }
      _Var4 = sysbvm_scanner_isIdentifierMiddle(uVar5);
      uVar2 = uVar6 + 1;
    } while (_Var4);
    if ((uVar6 < uVar1) && (puVar3[uVar6] == ':')) {
      state->position = uVar6 + 1;
      return true;
    }
  }
  return false;
}

Assistant:

static bool sysbvm_scanner_advanceKeyword(sysbvm_scannerState_t *state)
{
    if(!sysbvm_scanner_isIdentifierStart(sysbvm_scanner_lookAt(state, 0)))
        return false;

    sysbvm_scannerState_t endState = *state;
    while(sysbvm_scanner_isIdentifierMiddle(sysbvm_scanner_lookAt(&endState, 0)))
        ++endState.position;

    if(sysbvm_scanner_lookAt(&endState, 0) == ':')
    {
        ++endState.position;
        *state = endState;
        return true;
    }

    return false;
}